

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

upb_Array * upb_Message_GetArray(upb_Message *msg,upb_MiniTableField *f)

{
  upb_Message *to;
  upb_Array *f_00;
  _Bool _Var1;
  void *from;
  undefined8 local_48;
  upb_Array *default_val;
  upb_Array *ret;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  undefined8 *local_20;
  upb_Array *local_18;
  upb_MiniTableField *local_10;
  
  ret = (upb_Array *)f;
  f_local = (upb_MiniTableField *)msg;
  _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
  local_48 = 0;
  local_10 = f_local;
  local_18 = ret;
  local_20 = &local_48;
  msg_local = (upb_Message *)&default_val;
  _Var1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)ret);
  if (_Var1) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_18);
  if (((_Var1) ||
      (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                         ((upb_MiniTableField *)local_18,local_20), !_Var1)) &&
     (_Var1 = upb_Message_HasBaseField((upb_Message *)local_10,(upb_MiniTableField *)local_18),
     !_Var1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)local_18,msg_local,local_20);
    return default_val;
  }
  f_00 = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   ((upb_Message *)local_10,(upb_MiniTableField *)local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)f_00,to,from);
  return default_val;
}

Assistant:

UPB_API_INLINE const upb_Array* upb_Message_GetArray(
    const struct upb_Message* msg, const upb_MiniTableField* f) {
  UPB_PRIVATE(_upb_MiniTableField_CheckIsArray)(f);
  upb_Array* ret;
  const upb_Array* default_val = NULL;
  _upb_Message_GetNonExtensionField(msg, f, &default_val, &ret);
  return ret;
}